

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int QMetaTypeIdQObject<QAbstractItemModel_*,_8>::qt_metatype_id(void)

{
  char *__s;
  long in_FS_OFFSET;
  int newId;
  char *cName;
  int id;
  QByteArray typeName;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QByteArray *this;
  int local_2c;
  QByteArray local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x83d322);
  if (local_2c == 0) {
    __s = QMetaObject::className
                    ((QMetaObject *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    this = &local_28;
    QByteArray::QByteArray((QByteArray *)0x83d375);
    strlen(__s);
    QByteArray::reserve(this,(qsizetype)__s);
    QByteArray::append((QByteArray *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QByteArray::append((QByteArray *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (char)((uint)in_stack_ffffffffffffff9c >> 0x18));
    local_2c = qRegisterNormalizedMetaType<QAbstractItemModel*>((QByteArray *)0x83d3c2);
    QBasicAtomicInteger<int>::storeRelease
              ((QBasicAtomicInteger<int> *)CONCAT44(local_2c,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    QByteArray::~QByteArray((QByteArray *)0x83d3f2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *const cName = T::staticMetaObject.className();
        QByteArray typeName;
        typeName.reserve(strlen(cName) + 1);
        typeName.append(cName).append('*');
        const int newId = qRegisterNormalizedMetaType<T *>(typeName);
        metatype_id.storeRelease(newId);
        return newId;
    }